

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O0

bool vera::loadOBJ(string *_filename,Scene *_scene,bool _verbose)

{
  mapped_type pMVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  char *pcVar7;
  char *mtl_basedir;
  ulong uVar8;
  ostream *poVar9;
  size_type sVar10;
  reference pvVar11;
  Material *pMVar12;
  mapped_type *ppMVar13;
  reference pvVar14;
  reference pvVar15;
  uint32_t *puVar16;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this;
  pointer ppVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  mapped_type *_normal;
  vec3 vVar20;
  vec4 vVar21;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_6d8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_6d4;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [8];
  string meshName;
  _Self local_4c0;
  _Self local_4b8;
  vec3 local_4b0;
  vec3 local_4a0;
  vec4 local_490;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_480;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_47c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_478;
  vec3 local_470;
  _Self local_460;
  _Base_ptr local_458;
  byte local_449;
  undefined1 local_448 [7];
  bool reuse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  uint32_t local_3e8;
  int local_3e4;
  int material_index;
  int ti;
  int ni;
  int vi;
  index_t index;
  int f;
  size_t i;
  int local_3b8;
  uint32_t iCounter;
  int mCounter;
  int mi;
  iterator iter;
  map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
  unique_indices;
  key_type local_370;
  mapped_type local_350;
  Material *mat;
  key_type local_340;
  undefined1 local_31a;
  allocator local_319;
  string local_318;
  _Self local_2f8;
  allocator local_2e9;
  key_type local_2e8;
  _Self local_2c8;
  undefined1 local_2c0 [8];
  Mesh mesh;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  undefined1 local_1c8 [8];
  string name;
  size_t s;
  _Self local_198;
  ulong local_190;
  size_t m;
  byte local_17d;
  bool ret;
  allocator local_169;
  string local_168;
  undefined1 local_148 [8];
  string base_dir;
  string err;
  string warn;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t attrib;
  bool _verbose_local;
  Scene *_scene_local;
  string *_filename_local;
  
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = _verbose;
  tinyobj::attrib_t::attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
             &materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             ((long)&warn.field_2 + 8));
  std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(base_dir.field_2._M_local_buf + 8));
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,pcVar7,&local_169);
  getBaseDir((string *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  mtl_basedir = (char *)std::__cxx11::string::c_str();
  local_17d = tinyobj::LoadObj((attrib_t *)
                               &shapes.
                                super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                               &materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                               ((long)&warn.field_2 + 8),(string *)((long)&err.field_2 + 8),
                               (string *)((long)&base_dir.field_2 + 8),pcVar7,mtl_basedir,true,true)
  ;
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar9 = std::operator<<(poVar9,(string *)(err.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)(base_dir.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  if ((local_17d & 1) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to load ");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    _filename_local._7_1_ = false;
  }
  else {
    if ((attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Loading ");
      pcVar7 = (char *)std::__cxx11::string::c_str();
      poVar9 = std::operator<<(poVar9,pcVar7);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &shapes.
                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      printf("    Total vertices  = %d\n",(ulong)(uint)((int)sVar10 / 3));
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      printf("    Total colors    = %d\n",(ulong)(uint)((int)sVar10 / 3));
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      printf("    Total normals   = %d\n",(ulong)(uint)((int)sVar10 / 3));
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      printf("    Total texcoords = %d\n",
             (ulong)(uint)((int)sVar10 + (int)((sVar10 & 0xffffffff) >> 0x1f) >> 1));
      sVar10 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                         ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                          ((long)&warn.field_2 + 8));
      printf("    Total materials = %d\n",sVar10 & 0xffffffff);
      sVar10 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::size
                         ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                          &materials.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      printf("    Total shapes    = %d\n",sVar10 & 0xffffffff);
      poVar9 = std::operator<<((ostream *)&std::cerr,"Shapes: ");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    for (local_190 = 0; uVar8 = local_190,
        sVar10 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                           ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                            ((long)&warn.field_2 + 8)), uVar8 < sVar10; local_190 = local_190 + 1) {
      pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                          ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                           ((long)&warn.field_2 + 8),local_190);
      local_198._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
           ::find(&_scene->materials,&pvVar11->name);
      s = (size_t)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                  ::end(&_scene->materials);
      bVar6 = std::operator==(&local_198,(_Self *)&s);
      if (bVar6) {
        if ((attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Add Material ");
          pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                    operator[]((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                               ((long)&warn.field_2 + 8),local_190);
          poVar9 = std::operator<<(poVar9,(string *)pvVar11);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                             ((long)&warn.field_2 + 8),local_190);
        pMVar12 = InitMaterial(pvVar11,_scene,(string *)local_148);
        pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                             ((long)&warn.field_2 + 8),local_190);
        ppMVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](&_scene->materials,&pvVar11->name);
        *ppMVar13 = pMVar12;
      }
    }
    for (name.field_2._8_8_ = 0; uVar5 = name.field_2._8_8_,
        sVar10 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::size
                           ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                            &materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (ulong)uVar5 < sVar10; name.field_2._8_8_ = name.field_2._8_8_ + 1) {
      pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
      std::__cxx11::string::string((string *)local_1c8,(string *)pvVar14);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        toString<unsigned_long>
                  ((string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (unsigned_long *)(name.field_2._M_local_buf + 8));
        std::__cxx11::string::operator=
                  ((string *)local_1c8,
                   (string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      if ((attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)local_1c8);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      std::
      map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::map((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
             *)&mesh.m_material);
      pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                          ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                           &materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_);
      bVar6 = hasSmoothingGroup(pvVar14);
      if (bVar6) {
        if ((attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,"    . Compute smoothingNormal");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                             &materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_)
        ;
        computeSmoothingNormals
                  ((attrib_t *)
                   &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar14,
                   (map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                    *)&mesh.m_material);
      }
      Mesh::Mesh((Mesh *)local_2c0);
      Mesh::setDrawMode((Mesh *)local_2c0,TRIANGLES);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e8,"default",&local_2e9);
      local_2c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
           ::find(&_scene->materials,&local_2e8);
      local_2f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
           ::end(&_scene->materials);
      bVar6 = std::operator==(&local_2c8,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      if (bVar6) {
        pMVar12 = (Material *)operator_new(0x150);
        local_31a = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_318,"default",&local_319);
        Material::Material(pMVar12,&local_318);
        local_31a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"default",(allocator *)((long)&mat + 7));
        ppMVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](&_scene->materials,&local_340);
        *ppMVar13 = pMVar12;
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mat + 7));
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_370,"default",
                 (allocator *)
                 ((long)&unique_indices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      ppMVar13 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](&_scene->materials,&local_370);
      pMVar1 = *ppMVar13;
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&unique_indices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      local_350 = pMVar1;
      std::
      map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
      ::map((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
             *)&iter);
      std::_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_>::_Rb_tree_iterator
                ((_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_> *)&mCounter);
      iCounter = 0xffffffff;
      local_3b8 = 0;
      i._4_4_ = 0;
      stack0xfffffffffffffc38 = 0;
      while( true ) {
        uVar8 = stack0xfffffffffffffc38;
        pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                             &materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_)
        ;
        sVar10 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                           (&(pvVar14->mesh).indices);
        if (sVar10 <= uVar8) break;
        dVar2 = floor((double)(stack0xfffffffffffffc38 / 3));
        index.normal_index = (int)dVar2;
        pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                             &materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_)
        ;
        pvVar15 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                            (&(pvVar14->mesh).indices,stack0xfffffffffffffc38);
        ni = pvVar15->vertex_index;
        unique0x00012004 = pvVar15->normal_index;
        local_3e4 = pvVar15->texcoord_index;
        ti = ni;
        material_index = unique0x00012004;
        index.vertex_index = local_3e4;
        pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                             &materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,name.field_2._8_8_)
        ;
        sVar10 = std::vector<int,_std::allocator<int>_>::size(&(pvVar14->mesh).material_ids);
        if (sVar10 != 0) {
          pvVar14 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                              ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                               &materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               name.field_2._8_8_);
          puVar16 = (uint32_t *)
                    std::vector<int,_std::allocator<int>_>::operator[]
                              (&(pvVar14->mesh).material_ids,(long)index.normal_index);
          local_3e8 = *puVar16;
          if (iCounter != local_3e8) {
            if (iCounter != 0xffffffff) {
              this = Mesh::getVertices((Mesh *)local_2c0);
              sVar10 = std::
                       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ::size(this);
              if (sVar10 != 0) {
                std::operator+(&local_428,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1c8,"_");
                toString<int>((string *)local_448,&local_3b8,3,'0');
                std::operator+(&local_408,&local_428,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_448);
                addModel(_scene,&local_408,(Mesh *)local_2c0,local_350,
                         (bool)(attrib.colors.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
                std::__cxx11::string::~string((string *)&local_408);
                std::__cxx11::string::~string((string *)local_448);
                std::__cxx11::string::~string((string *)&local_428);
                local_3b8 = local_3b8 + 1;
                i._4_4_ = 0;
                Mesh::clear((Mesh *)local_2c0);
                std::
                map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                ::clear((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                         *)&iter);
              }
            }
            iCounter = local_3e8;
            pvVar11 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                      operator[]((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                  *)((long)&warn.field_2 + 8),(long)(int)local_3e8);
            ppMVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                       ::operator[](&_scene->materials,&pvVar11->name);
            local_350 = *ppMVar13;
          }
        }
        local_449 = 0;
        local_458 = (_Base_ptr)
                    std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::find((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                            *)&iter,&ti);
        _mCounter = (iterator)local_458;
        local_460._M_node =
             (_Base_ptr)
             std::
             map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
             ::end((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    *)&iter);
        bVar6 = std::operator!=((_Self *)&mCounter,&local_460);
        if (((bVar6) &&
            (ppVar17 = std::_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_> *)
                                  &mCounter), (ppVar17->second).normal_index == material_index)) &&
           (ppVar17 = std::_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_>::operator->
                                ((_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_> *)
                                 &mCounter), (ppVar17->second).texcoord_index == local_3e4)) {
          local_449 = 1;
        }
        if ((local_449 & 1) == 0) {
          pmVar18 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&iter,&ti);
          iVar4 = material_index;
          pmVar18->vertex_index = i._4_4_;
          pmVar18 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&iter,&ti);
          iVar3 = local_3e4;
          pmVar18->normal_index = iVar4;
          pmVar18 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&iter,&ti);
          pmVar18->texcoord_index = iVar3;
          vVar20 = getVertex((attrib_t *)
                             &shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,ti);
          local_478 = vVar20.field_2;
          local_470._0_8_ = vVar20._0_8_;
          local_6d8 = vVar20.field_0;
          aStack_6d4 = vVar20.field_1;
          local_480 = local_6d8;
          aStack_47c = aStack_6d4;
          local_470.field_2 = local_478;
          Mesh::addVertex((Mesh *)local_2c0,&local_470);
          vVar21 = getColor((attrib_t *)
                            &shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,ti);
          local_490._8_8_ = vVar21._8_8_;
          local_490._0_8_ = vVar21._0_8_;
          Mesh::addColor((Mesh *)local_2c0,&local_490);
          sVar10 = std::vector<float,_std::allocator<float>_>::size
                             ((vector<float,_std::allocator<float>_> *)
                              &attrib.vertex_weights.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          if (sVar10 == 0) {
            sVar19 = std::
                     map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                     ::size((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                             *)&mesh.m_material);
            if (sVar19 != 0) {
              local_4b8._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::find((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                           *)&mesh.m_material,&ti);
              local_4c0._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                   ::end((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                          *)&mesh.m_material);
              bVar6 = std::operator!=(&local_4b8,&local_4c0);
              if (bVar6) {
                _normal = std::
                          map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                          ::at((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                                *)&mesh.m_material,&ti);
                Mesh::addNormal((Mesh *)local_2c0,_normal);
              }
            }
          }
          else {
            vVar20 = getNormal((attrib_t *)
                               &shapes.
                                super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,material_index);
            local_4b0.field_2 = vVar20.field_2;
            local_4b0._0_8_ = vVar20._0_8_;
            local_4a0._0_8_ = local_4b0._0_8_;
            local_4a0.field_2 = local_4b0.field_2;
            Mesh::addNormal((Mesh *)local_2c0,&local_4a0);
          }
          sVar10 = std::vector<float,_std::allocator<float>_>::size
                             ((vector<float,_std::allocator<float>_> *)
                              &attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar10 != 0) {
            meshName.field_2._8_8_ =
                 getTexCoords((attrib_t *)
                              &shapes.
                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3e4);
            Mesh::addTexCoord((Mesh *)local_2c0,(vec2 *)((long)&meshName.field_2 + 8));
          }
          Mesh::addIndex((Mesh *)local_2c0,i._4_4_);
          i._4_4_ = i._4_4_ + 1;
        }
        else {
          ppVar17 = std::_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_int,_tinyobj::index_t>_> *)
                               &mCounter);
          Mesh::addIndex((Mesh *)local_2c0,(ppVar17->second).vertex_index);
        }
        register0x00000000 = stack0xfffffffffffffc38 + 1;
      }
      std::__cxx11::string::string((string *)local_4e8,(string *)local_1c8);
      if (0 < local_3b8) {
        std::operator+(&local_528,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"_");
        toString<int>(&local_548,&local_3b8,3,'0');
        std::operator+(&local_508,&local_528,&local_548);
        std::__cxx11::string::operator=((string *)local_4e8,(string *)&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_528);
      }
      addModel(_scene,(string *)local_4e8,(Mesh *)local_2c0,local_350,
               (bool)(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::~string((string *)local_4e8);
      std::
      map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
      ::~map((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
              *)&iter);
      Mesh::~Mesh((Mesh *)local_2c0);
      std::
      map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::~map((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)&mesh.m_material);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    _filename_local._7_1_ = true;
  }
  m._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)(base_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             ((long)&warn.field_2 + 8));
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
             &materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tinyobj::attrib_t::~attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return _filename_local._7_1_;
}

Assistant:

bool loadOBJ(const std::string& _filename, Scene* _scene, bool _verbose) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) {
        std::cout << "WARN: " << warn << std::endl;
    }
    if (!err.empty()) {
        std::cerr << err << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    // Append `default` material
    // materials.push_back(tinyobj::material_t());

    if (_verbose) {
        std::cerr << "Loading " << _filename.c_str() << std::endl;
        printf("    Total vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
        printf("    Total colors    = %d\n", (int)(attrib.colors.size()) / 3);
        printf("    Total normals   = %d\n", (int)(attrib.normals.size()) / 3);
        printf("    Total texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
        printf("    Total materials = %d\n", (int)materials.size());
        printf("    Total shapes    = %d\n", (int)shapes.size());

        std::cerr << "Shapes: " << std::endl;
    }

    for (size_t m = 0; m < materials.size(); m++) {
        if ( _scene->materials.find( materials[m].name ) == _scene->materials.end() ) {
            if (_verbose)
                std::cout << "Add Material " << materials[m].name << std::endl;

            _scene->materials[ materials[m].name ] = InitMaterial( materials[m], _scene, base_dir );
        }
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        if (_verbose)
            std::cerr << name << std::endl;

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0) {
            if (_verbose)
                std::cout << "    . Compute smoothingNormal" << std::endl;
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);
        }

        Mesh mesh;
        mesh.setDrawMode(TRIANGLES);

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* mat = _scene->materials["default"];

        std::map<int, tinyobj::index_t> unique_indices;
        std::map<int, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        int mCounter = 0;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {
            int f = (int)floor(i/3);

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // Associate w material
            if (shapes[s].mesh.material_ids.size() > 0) {
                int material_index = shapes[s].mesh.material_ids[f];
                if (mi != material_index) {

                    // If there is a switch of material start a new mesh
                    if (mi != -1 && mesh.getVertices().size() > 0) {

                        // std::cout << "Adding model " << name  << "_" << toString(mCounter, 3, '0') << " w new material " << mat.name << std::endl;
                        
                        // Add the model to the stack 
                        addModel(_scene, name + "_"+ toString(mCounter,3,'0'), mesh, mat, _verbose);
                        mCounter++;

                        // Restart the mesh
                        iCounter = 0;
                        mesh.clear();
                        unique_indices.clear();
                    }

                    // assign the current material
                    mi = material_index;
                    mat = _scene->materials[ materials[material_index].name ];
                }
            }

            bool reuse = false;
            iter = unique_indices.find(vi);

                        // if already exist 
            if (iter != unique_indices.end())
                // and have the same attributes
                if ((iter->second.normal_index == ni) &&
                    (iter->second.texcoord_index == ti) )
                    reuse = true;
            
            // Re use the vertex
            if (reuse)
                mesh.addIndex( (INDEX_TYPE)iter->second.vertex_index );
            // Other wise create a new one
            else {
                unique_indices[vi].vertex_index = (int)iCounter;
                unique_indices[vi].normal_index = ni;
                unique_indices[vi].texcoord_index = ti;
                
                mesh.addVertex( getVertex(attrib, vi) );
                mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    mesh.addTexCoord( getTexCoords(attrib, ti) );

                mesh.addIndex( iCounter++ );
            }
        }

        std::string meshName = name;
        if (mCounter > 0)
            meshName = name + "_" + toString(mCounter, 3, '0');

        // std::cout << "Adding model " << meshName << " w material " << mat.name << std::endl;
        addModel(_scene, meshName, mesh, mat, _verbose);
    }

    return true;
}